

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O0

bool __thiscall NodeView::is_bubble_side(NodeView *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  bool bVar4;
  NodeView NVar5;
  vector<LinkView,_std::allocator<LinkView>_> n;
  vector<LinkView,_std::allocator<LinkView>_> p;
  NodeView *in_stack_00000328;
  vector<LinkView,_std::allocator<LinkView>_> *in_stack_ffffffffffffff10;
  vector<LinkView,_std::allocator<LinkView>_> local_b0;
  byte local_91;
  NodeView local_90;
  vector<LinkView,_std::allocator<LinkView>_> local_80;
  NodeView *in_stack_ffffffffffffff98;
  vector<LinkView,_std::allocator<LinkView>_> local_40;
  vector<LinkView,_std::allocator<LinkView>_> local_28;
  byte local_1;
  
  prev(in_stack_ffffffffffffff98);
  next(in_stack_ffffffffffffff98);
  local_91 = 0;
  bVar1 = false;
  parallels(in_stack_00000328);
  sVar2 = std::vector<NodeView,_std::allocator<NodeView>_>::size
                    ((vector<NodeView,_std::allocator<NodeView>_> *)&stack0xffffffffffffff98);
  bVar4 = false;
  if (sVar2 == 1) {
    sVar2 = std::vector<LinkView,_std::allocator<LinkView>_>::size(&local_28);
    bVar4 = false;
    if (sVar2 == 1) {
      sVar2 = std::vector<LinkView,_std::allocator<LinkView>_>::size(&local_40);
      bVar4 = false;
      if (sVar2 == 1) {
        pvVar3 = std::vector<LinkView,_std::allocator<LinkView>_>::operator[](&local_28,0);
        local_90 = LinkView::node(pvVar3);
        next(in_stack_ffffffffffffff98);
        local_91 = 1;
        sVar2 = std::vector<LinkView,_std::allocator<LinkView>_>::size(&local_80);
        bVar4 = false;
        if (sVar2 == 2) {
          pvVar3 = std::vector<LinkView,_std::allocator<LinkView>_>::operator[](&local_40,0);
          NVar5 = LinkView::node(pvVar3);
          in_stack_ffffffffffffff10 = (vector<LinkView,_std::allocator<LinkView>_> *)NVar5.id;
          prev(in_stack_ffffffffffffff98);
          bVar1 = true;
          sVar2 = std::vector<LinkView,_std::allocator<LinkView>_>::size(&local_b0);
          bVar4 = sVar2 == 2;
        }
      }
    }
  }
  if (bVar1) {
    std::vector<LinkView,_std::allocator<LinkView>_>::~vector(in_stack_ffffffffffffff10);
  }
  if ((local_91 & 1) != 0) {
    std::vector<LinkView,_std::allocator<LinkView>_>::~vector(in_stack_ffffffffffffff10);
  }
  std::vector<NodeView,_std::allocator<NodeView>_>::~vector
            ((vector<NodeView,_std::allocator<NodeView>_> *)in_stack_ffffffffffffff10);
  local_1 = bVar4;
  std::vector<LinkView,_std::allocator<LinkView>_>::~vector(in_stack_ffffffffffffff10);
  std::vector<LinkView,_std::allocator<LinkView>_>::~vector(in_stack_ffffffffffffff10);
  return (bool)(local_1 & 1);
}

Assistant:

bool NodeView::is_bubble_side() const {
    auto p=prev();
    auto n=next();
    if ( parallels().size()== 1 and p.size()==1 and n.size()==1 and p[0].node().next().size()==2 and n[0].node().prev().size()==2) {
        return true;
    }
    return false;
}